

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseModuleFieldList(WastParser *this,Module *module)

{
  ModuleFieldType MVar1;
  int iVar2;
  Errors *errors;
  _func_int **pp_Var3;
  bool bVar4;
  bool bVar5;
  TokenType TVar6;
  TokenType TVar7;
  Result RVar8;
  Enum EVar9;
  FuncDeclaration *decl;
  _func_int **pp_Var10;
  Func *func;
  ModuleField *field;
  ModuleField *pMVar11;
  ResolveFuncTypesExprVisitorDelegate delegate;
  Delegate local_98;
  Module *local_90;
  Errors *local_88;
  ExprVisitor local_80;
  
  TVar6 = Peek(this,0);
  TVar7 = Peek(this,1);
  while (((TVar6 == Lpar && (TVar7 < I8X16)) && ((0x150011ad400U >> ((ulong)TVar7 & 0x3f) & 1) != 0)
         )) {
    RVar8 = ParseModuleField(this,module);
    if ((RVar8.enum_ == Error) &&
       (RVar8 = Synchronize(this,anon_unknown_1::IsModuleField), RVar8.enum_ == Error)) {
      return (Result)Error;
    }
    TVar6 = Peek(this,0);
    TVar7 = Peek(this,1);
  }
  RVar8 = ResolveNamesModule(module,this->errors_);
  EVar9 = Error;
  if (RVar8.enum_ != Error) {
    pMVar11 = (module->fields).first_;
    if (pMVar11 == (ModuleField *)0x0) {
      EVar9 = Ok;
    }
    else {
      errors = this->errors_;
      bVar5 = false;
      do {
        MVar1 = pMVar11->type_;
        if (MVar1 == Event) {
          decl = (FuncDeclaration *)&pMVar11[1].loc.filename.size_;
          bVar4 = true;
LAB_0022e8df:
          func = (Func *)0x0;
        }
        else {
          if (MVar1 == Import) {
            pp_Var3 = pMVar11[1]._vptr_ModuleField;
            iVar2 = *(int *)(pp_Var3 + 9);
            pp_Var10 = pp_Var3;
            if (iVar2 != 4) {
              pp_Var10 = (_func_int **)0x0;
            }
            decl = (FuncDeclaration *)(pp_Var10 + 0xe);
            if (pp_Var10 == (_func_int **)0x0) {
              decl = (FuncDeclaration *)0x0;
            }
            if (pp_Var3 != (_func_int **)0x0 && iVar2 == 0) {
              decl = (FuncDeclaration *)(pp_Var3 + 0xe);
            }
            bVar4 = pp_Var10 != (_func_int **)0x0 || pp_Var3 != (_func_int **)0x0 && iVar2 == 0;
            goto LAB_0022e8df;
          }
          if (MVar1 == Func) {
            func = (Func *)(pMVar11 + 1);
            decl = (FuncDeclaration *)&pMVar11[1].loc.filename.size_;
            bVar4 = true;
          }
          else {
            decl = (FuncDeclaration *)0x0;
            func = (Func *)0x0;
            bVar4 = false;
          }
        }
        if (bVar4) {
          if (decl != (FuncDeclaration *)0x0) {
            anon_unknown_1::ResolveFuncTypeWithEmptySignature(module,decl);
            anon_unknown_1::ResolveImplicitlyDefinedFunctionType(&pMVar11->loc,module,decl);
            RVar8 = anon_unknown_1::CheckFuncTypeVarMatchesExplicit
                              (&pMVar11->loc,module,decl,errors);
            bVar5 = RVar8.enum_ == Error || bVar5;
          }
          if (func != (Func *)0x0) {
            local_98._vptr_Delegate = (_func_int **)&PTR__Delegate_002cd3a8;
            local_90 = module;
            local_88 = errors;
            ExprVisitor::ExprVisitor(&local_80,&local_98);
            RVar8 = ExprVisitor::VisitFunc(&local_80,func);
            if (local_80.expr_iter_stack_.
                super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_80.expr_iter_stack_.
                              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_80.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_80.expr_stack_.
                              super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_80.state_stack_.
                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_80.state_stack_.
                              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            bVar5 = bVar5 || RVar8.enum_ == Error;
          }
        }
        pMVar11 = (pMVar11->super_intrusive_list_base<wabt::ModuleField>).next_;
      } while (pMVar11 != (ModuleField *)0x0);
      EVar9 = (Enum)bVar5;
    }
  }
  return (Result)EVar9;
}

Assistant:

Result WastParser::ParseModuleFieldList(Module* module) {
  WABT_TRACE(ParseModuleFieldList);
  while (IsModuleField(PeekPair())) {
    if (Failed(ParseModuleField(module))) {
      CHECK_RESULT(Synchronize(IsModuleField));
    }
  }
  CHECK_RESULT(ResolveNamesModule(module, errors_));
  CHECK_RESULT(ResolveFuncTypes(module, errors_));
  return Result::Ok;
}